

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xdr_inline.h
# Opt level: O1

_Bool xdr_string_decode(XDR *xdrs,char **cpp,u_int maxsize)

{
  uint *puVar1;
  uint uVar2;
  _Bool _Var3;
  char *pcVar4;
  ulong uVar5;
  uint32_t size;
  uint local_30;
  char local_2c [4];
  
  pcVar4 = *cpp;
  puVar1 = (uint *)((long)xdrs->x_data + 4);
  if ((xdrs->x_v).vio_tail < puVar1) {
    _Var3 = (*xdrs->x_ops->x_getunit)(xdrs,&local_30);
    if (!_Var3) {
      if (((byte)__ntirpc_pkg_params.debug_flags & 1) == 0) {
        return false;
      }
      (*__ntirpc_pkg_params.warnx_)("%s:%u ERROR size","xdr_string_decode",0x3a7);
      return false;
    }
  }
  else {
    uVar2 = *(uint *)xdrs->x_data;
    local_30 = uVar2 >> 0x18 | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 | uVar2 << 0x18;
    xdrs->x_data = (uint8_t *)puVar1;
  }
  uVar5 = (ulong)local_30;
  if (uVar5 < 0x2329) {
    if (pcVar4 == (char *)0x0) {
      pcVar4 = (char *)(*__ntirpc_pkg_params.malloc_)
                                 (uVar5 + 1,
                                  "/workspace/llm4binary/github/license_c_cmakelists/linuxbox2[P]ntirpc/ntirpc/rpc/xdr_inline.h"
                                  ,0x3c1,"xdr_string_decode");
    }
    uVar2 = local_30;
    if (local_30 == 0) goto LAB_00119930;
    _Var3 = (*xdrs->x_ops->x_getbytes)(xdrs,pcVar4,local_30);
    if (_Var3) {
      if (((uVar2 & 3) == 0) ||
         (_Var3 = (*xdrs->x_ops->x_getbytes)(xdrs,local_2c,4 - (uVar2 & 3)), _Var3)) {
LAB_00119930:
        pcVar4[local_30] = '\0';
        *cpp = pcVar4;
        return true;
      }
      if (((byte)__ntirpc_pkg_params.debug_flags & 1) != 0) {
        (*__ntirpc_pkg_params.warnx_)("%s:%u ERROR crud","xdr_opaque_decode",0x1c9);
      }
      if (_Var3) goto LAB_00119930;
    }
    else if (((byte)__ntirpc_pkg_params.debug_flags & 1) != 0) {
      (*__ntirpc_pkg_params.warnx_)("%s:%u ERROR opaque","xdr_opaque_decode",0x1b9);
    }
    (*__ntirpc_pkg_params.free_size_)(pcVar4,uVar5 + 1 & 0xffffffff);
  }
  else if (((byte)__ntirpc_pkg_params.debug_flags & 1) != 0) {
    (*__ntirpc_pkg_params.warnx_)
              ("%s:%u ERROR size %u > max %u","xdr_string_decode",0x3ae,uVar5,9000);
    return false;
  }
  return false;
}

Assistant:

static inline bool
xdr_string_decode(XDR *xdrs, char **cpp, u_int maxsize)
{
	char *sp = *cpp;	/* sp is the actual string pointer */
	uint32_t size;
	u_int nodesize;
	bool ret;

	/*
	 * first deal with the length since xdr strings are counted-strings
	 */
	if (!XDR_GETUINT32(xdrs, &size)) {
		__warnx(TIRPC_DEBUG_FLAG_ERROR,
			"%s:%u ERROR size",
			__func__, __LINE__);
		return (false);
	}

	if (size > maxsize) {
		__warnx(TIRPC_DEBUG_FLAG_ERROR,
			"%s:%u ERROR size %" PRIu32 " > max %u",
			__func__, __LINE__,
			size, maxsize);
		return (false);
	}

	nodesize = (uint32_t)(size + 1);
	if (nodesize < (size + 1)) {
		/* caller provided very large maxsize */
		__warnx(TIRPC_DEBUG_FLAG_ERROR,
			"%s:%u ERROR overflow %" PRIu32,
			__func__, __LINE__,
			size);
		return (false);
	}

	/*
	 * now deal with the actual bytes
	 */
	if (!sp)
		sp = (char *)mem_alloc(nodesize);

	ret = xdr_opaque_decode(xdrs, sp, size);
	if (!ret) {
		mem_free(sp, nodesize);
		return (ret);
	}
	sp[size] = '\0';
	*cpp = sp;			/* only valid pointer */
	return (ret);
}